

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O1

void __thiscall
m2d::savanna::ssl_reuse::
https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::https_logic(https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
              *this,shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>
                    *ssl_stream,
             shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
             *resolver,
             delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
             *delegate,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
             *ssl_cache,nanoseconds timeout_interval)

{
  node_ptr prVar1;
  list_t *plVar2;
  node_ptr plVar3;
  
  (this->super_interface).super_enable_shared_from_this<m2d::savanna::ssl_reuse::interface>.
  _M_weak_this.super___weak_ptr<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->super_interface).super_enable_shared_from_this<m2d::savanna::ssl_reuse::interface>.
  _M_weak_this.super___weak_ptr<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_interface)._vptr_interface = (_func_int **)&PTR_on_resolve_l_002708e8;
  (this->buffer_).begin_ = (char *)0x0;
  (this->buffer_).in_ = (char *)0x0;
  (this->buffer_).out_ = (char *)0x0;
  (this->buffer_).last_ = (char *)0x0;
  (this->buffer_).end_ = (char *)0x0;
  (this->ssl_stream_).
  super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->ssl_stream_).
  super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->resolver_).
  super___shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->resolver_).
  super___shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->buffer_).max_ = 0x7fffffffffffffff;
  prVar1 = (node_ptr)
           ((long)&(this->response_).
                   super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                   super_basic_fields<std::allocator<char>_>.set_.
                   super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           + 8);
  (((bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
     *)((long)&(this->response_).
               super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
               super_basic_fields<std::allocator<char>_>.set_.
               super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
               .
               super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
               .
               super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
       + 8))->
  super_bstbase3<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  ).holder.root.super_node.parent_ = (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(this->response_).
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x10) = (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(this->response_).
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x18) = (node_ptr)0x0;
  *(undefined8 *)
   ((long)&(this->response_).
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x20) = 0;
  *(node_ptr *)
   ((long)&(this->response_).
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x10) = prVar1;
  *(node_ptr *)
   ((long)&(this->response_).
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x18) = prVar1;
  *(color *)((long)&(this->response_).
                    super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                    super_basic_fields<std::allocator<char>_>.set_.
                    super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            + 0x20) = red_t;
  (this->response_).super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.set_.
  super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void> = 0;
  plVar2 = &(this->response_).
            super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
            super_basic_fields<std::allocator<char>_>.list_;
  (this->response_).super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(this->response_).
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header + 8) =
       (node_ptr)0x0;
  (this->response_).super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)plVar2;
  *(list_t **)
   ((long)&(this->response_).
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header + 8) =
       plVar2;
  (this->response_).super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.target_or_reason_.ptr_ = (char *)0x0;
  (this->response_).super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.target_or_reason_.len_ = 0;
  (this->response_).super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.method_.ptr_ = (char *)0x0;
  (this->response_).super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.method_.len_ = 0;
  (this->response_).super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  version_ = 0xb;
  (this->response_).super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  result_ = ok;
  (this->response_).
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.value_.max_
       = 0xfffffffffffffff;
  plVar3 = &(this->response_).
            super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
            value_.list_.data_.root_plus_size_.m_header.super_node;
  *(node_ptr *)
   ((long)&(this->response_).
           super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
           value_.list_.data_.root_plus_size_.m_header + 8) = (node_ptr)0x0;
  (this->response_).
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.value_.list_
  .data_.root_plus_size_.super_size_traits.size_ = 0;
  (this->response_).
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.value_.list_
  .data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  (this->response_).
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.value_.list_
  .data_.root_plus_size_.m_header.super_node.next_ = plVar3;
  *(node_ptr *)
   ((long)&(this->response_).
           super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
           value_.list_.data_.root_plus_size_.m_header + 8) = plVar3;
  (this->response_).
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.value_.out_.
  members_.nodeptr_ = plVar3;
  (this->response_).
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.value_.
  out_pos_ = 0;
  (this->response_).
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.value_.
  out_end_ = 0;
  (this->response_).
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.value_.
  in_size_ = 0;
  (this->response_).
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.value_.
  in_pos_ = 0;
  prVar1 = (node_ptr)
           ((long)&(this->request_).
                   super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                   super_basic_fields<std::allocator<char>_>.set_.
                   super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           + 8);
  *(node_ptr *)
   ((long)&(this->request_).
           super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x18) = (node_ptr)0x0;
  *(undefined8 *)
   ((long)&(this->request_).
           super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x20) = 0;
  (((bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
     *)((long)&(this->request_).
               super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
               super_basic_fields<std::allocator<char>_>.set_.
               super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
               .
               super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
               .
               super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
       + 8))->
  super_bstbase3<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  ).holder.root.super_node.parent_ = (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(this->request_).
           super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x10) = (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(this->request_).
           super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x10) = prVar1;
  *(node_ptr *)
   ((long)&(this->request_).
           super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
   + 0x18) = prVar1;
  *(color *)((long)&(this->request_).
                    super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                    super_basic_fields<std::allocator<char>_>.set_.
                    super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            + 0x20) = red_t;
  (this->request_).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.set_.
  super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void> = 0;
  plVar2 = &(this->request_).
            super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
            super_basic_fields<std::allocator<char>_>.list_;
  (this->request_).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(this->request_).
           super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header + 8) =
       (node_ptr)0x0;
  (this->request_).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)plVar2;
  *(list_t **)
   ((long)&(this->request_).
           super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
           super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header + 8) =
       plVar2;
  (this->request_).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.target_or_reason_.ptr_ = (char *)0x0;
  (this->request_).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.target_or_reason_.len_ = 0;
  (this->request_).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.method_.ptr_ = (char *)0x0;
  (this->request_).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.method_.len_ = 0;
  (this->request_).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  version_ = 0xb;
  (this->request_).super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  method_ = unknown;
  (this->request_).
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_._M_dataplus._M_p =
       (pointer)&(this->request_).
                 super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                 .value_.field_2;
  (this->request_).
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_._M_string_length = 0;
  (this->request_).
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_.field_2._M_local_buf[0] = '\0';
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  (this->ipaddress_)._M_dataplus._M_p = (pointer)&(this->ipaddress_).field_2;
  (this->ipaddress_)._M_string_length = 0;
  (this->ipaddress_).field_2._M_local_buf[0] = '\0';
  (this->resolver_).
  super___shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (resolver->
            super___shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->resolver_).
              super___shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(resolver->
              super___shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  (this->ssl_stream_).
  super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (ssl_stream->
            super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ssl_stream_).
              super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(ssl_stream->
              super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  this->delegate_ = delegate;
  this->ssl_cache_ = ssl_cache;
  (this->timeout_interval_).__r = timeout_interval.__r;
  return;
}

Assistant:

https_logic(std::shared_ptr<beast::ssl_stream<beast::tcp_stream>> ssl_stream, std::shared_ptr<tcp::resolver> resolver, delegate<Body>* delegate, std::map<std::string, std::shared_ptr<SSL_SESSION>>* ssl_cache, std::chrono::nanoseconds timeout_interval){
			resolver_ = resolver;
			ssl_stream_ = ssl_stream;
			delegate_ = delegate;
			ssl_cache_ = ssl_cache;
			timeout_interval_ = timeout_interval;
		}